

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O2

int nn_surveyor_send(nn_sockbase *self,nn_msg *msg)

{
  int type;
  uint uVar1;
  size_t sVar2;
  uint8_t *buf;
  
  *(uint *)((long)&self[0x20].sock + 4) = *(int *)((long)&self[0x20].sock + 4) + 1U | 0x80000000;
  sVar2 = nn_chunkref_size(&msg->sphdr);
  if (sVar2 != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_chunkref_size (&msg->sphdr) == 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/survey/surveyor.c"
            ,0xcd);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_chunkref_term(&msg->sphdr);
  nn_chunkref_init(&msg->sphdr,4);
  buf = (uint8_t *)nn_chunkref_data(&msg->sphdr);
  nn_putl(buf,*(uint32_t *)((long)&self[0x20].sock + 4));
  nn_msg_term((nn_msg *)&self[0x2f].sock);
  nn_msg_mv((nn_msg *)&self[0x2f].sock,msg);
  nn_msg_init(msg,0);
  if ((*(uint *)&self[0x20].sock < 7) && ((0x46U >> (*(uint *)&self[0x20].sock & 0x1f) & 1) != 0)) {
    type = 1;
  }
  else {
    uVar1 = nn_xsurveyor_events(self);
    if ((uVar1 & 2) == 0) {
      return -0xb;
    }
    type = 2;
  }
  nn_fsm_action((nn_fsm *)(self + 0x1b),type);
  return 0;
}

Assistant:

static int nn_surveyor_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    struct nn_surveyor *surveyor;

    surveyor = nn_cont (self, struct nn_surveyor, xsurveyor.sockbase);

    /*  Generate new survey ID. */
    ++surveyor->surveyid;
    surveyor->surveyid |= 0x80000000;

    /*  Tag the survey body with survey ID. */
    nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_init (&msg->sphdr, 4);
    nn_putl (nn_chunkref_data (&msg->sphdr), surveyor->surveyid);

    /*  Store the survey, so that it can be sent later on. */
    nn_msg_term (&surveyor->tosend);
    nn_msg_mv (&surveyor->tosend, msg);
    nn_msg_init (msg, 0);

    /*  Cancel any ongoing survey, if any. */
    if (nn_slow (nn_surveyor_inprogress (surveyor))) {

        /*  First check whether the survey can be sent at all. */
        if (!(nn_xsurveyor_events (&surveyor->xsurveyor.sockbase) &
              NN_SOCKBASE_EVENT_OUT))
            return -EAGAIN;

        /*  Cancel the current survey. */
        nn_fsm_action (&surveyor->fsm, NN_SURVEYOR_ACTION_CANCEL);

        return 0;
    }

    /*  Notify the state machine that the survey was started. */
    nn_fsm_action (&surveyor->fsm, NN_SURVEYOR_ACTION_START);

    return 0;
}